

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void check_analyze(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  bVar1 = is_npc(ch);
  if (((!bVar1) && (bVar1 = style_check((int)gsn_analyze,(int)ch->pcdata->style), bVar1)) &&
     (iVar2 = get_skill(ch,(int)gsn_analyze), iVar2 != 0)) {
    iVar3 = get_curr_stat(ch,1);
    iVar4 = number_percent();
    if (iVar4 <= iVar3 * 5 + iVar2 + -0x7d) {
      if (ch->analyzePC != victim) {
        ch->analyze = 0;
      }
      ch->analyzePC = ch->fighting;
      bVar1 = is_npc(victim);
      if ((bVar1) && (iVar2 = number_percent(), 0x28 < iVar2)) {
        return;
      }
      if (ch->analyze < 0x32) {
        ch->analyze = ch->analyze + 1;
      }
      check_improve(ch,(int)gsn_analyze,true,6);
      return;
    }
  }
  return;
}

Assistant:

void check_analyze(CHAR_DATA *ch, CHAR_DATA *victim)
{
	int intel, skill;
	if (is_npc(ch))
	{
	/*
		skill = 30 + ch->level;
		if (number_percent () > (skill - 125 + (5 * get_curr_stat(ch,STAT_INT))))
			return;

		if (victim != ch->analyzePC)
			ch->analyze = 0;

		ch->analyzePC = ch->fighting;
		if (ch->analyze < 50)
			ch->analyze++;
	*/
		return;
	}

	if (!style_check(gsn_analyze, ch->pcdata->style))
		return;

	skill = get_skill(ch, gsn_analyze);

	if (skill == 0)
		return;

	intel = get_curr_stat(ch, STAT_INT);

	if (number_percent() > (skill - 125 + (5 * intel)))
		return;

	if (victim != ch->analyzePC)
		ch->analyze = 0;

	ch->analyzePC = ch->fighting;

	if (is_npc(victim))
	{
		if (number_percent() > 40)
			return;
	}

	if (ch->analyze < 50)
		ch->analyze++;

	check_improve(ch, gsn_analyze, true, 6);
}